

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

void __thiscall
FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::get_PictureEssenceCoding
          (FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *this,FILE *stream)

{
  long *plVar1;
  Dictionary *pDVar2;
  byte_t *pbVar3;
  Result_t local_110 [120];
  Result_t local_98 [8];
  Result_t result;
  CDCIEssenceDescriptor *cdci_descriptor;
  RGBAEssenceDescriptor *rgba_descriptor;
  Dictionary *Dict;
  FILE *stream_local;
  FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *this_local;
  
  ASDCP::DefaultCompositeDict();
  plVar1 = (long *)AS_02::JP2K::MXFReader::OP1aHeader();
  pDVar2 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar3 = ASDCP::Dictionary::ul(pDVar2,MDD_RGBAEssenceDescriptor);
  (**(code **)(*plVar1 + 0xa8))(local_98,plVar1,pbVar3);
  Kumu::Result_t::operator_cast_to_int(local_98);
  plVar1 = (long *)AS_02::JP2K::MXFReader::OP1aHeader();
  pDVar2 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar3 = ASDCP::Dictionary::ul(pDVar2,MDD_CDCIEssenceDescriptor);
  (**(code **)(*plVar1 + 0xa8))(local_110,plVar1,pbVar3);
  Kumu::Result_t::operator=(local_98,local_110);
  Kumu::Result_t::~Result_t(local_110);
  Kumu::Result_t::operator_cast_to_int(local_98);
  Kumu::Result_t::~Result_t(local_98);
  return;
}

Assistant:

void get_PictureEssenceCoding(FILE* stream = 0)
  {
    const Dictionary& Dict = DefaultCompositeDict();
    MXF::RGBAEssenceDescriptor *rgba_descriptor = 0;
    MXF::CDCIEssenceDescriptor *cdci_descriptor = 0;

    Result_t result = m_Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_RGBAEssenceDescriptor),
							      reinterpret_cast<MXF::InterchangeObject**>(&rgba_descriptor));

    if ( KM_SUCCESS(result) && rgba_descriptor)
      m_PictureEssenceCoding = rgba_descriptor->PictureEssenceCoding;
    else{
    	result = m_Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_CDCIEssenceDescriptor),
    								      reinterpret_cast<MXF::InterchangeObject**>(&cdci_descriptor));
        if ( KM_SUCCESS(result) && cdci_descriptor)
          m_PictureEssenceCoding = cdci_descriptor->PictureEssenceCoding;
    }
  }